

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<int,_true,_std::allocator<unsigned_long>_> *in)

{
  void *__dest;
  pointer __src;
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  size_t sVar4;
  size_t *psVar5;
  bool *pbVar6;
  int *piVar7;
  reference piVar8;
  ulong local_70;
  size_t j_1;
  const_iterator it;
  size_t j;
  allocator<int> local_19;
  View<int,_true,_std::allocator<unsigned_long>_> *local_18;
  View<int,_true,_std::allocator<unsigned_long>_> *in_local;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  
  local_18 = in;
  in_local = (View<int,_true,_std::allocator<unsigned_long>_> *)this;
  std::allocator<int>::allocator(&local_19);
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,&local_19);
  std::allocator<int>::~allocator(&local_19);
  std::allocator<int>::allocator((allocator<int> *)(this + 0x40));
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(local_18);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_18->geometry_);
  it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    puVar1 = it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar3 = (pointer)View<int,_true,_std::allocator<unsigned_long>_>::dimension(local_18);
    if (puVar3 <= puVar1) break;
    sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                      (&local_18->geometry_,
                       (size_t)it.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),
                        (size_t)it.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    *psVar5 = sVar4;
    it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)it.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  pbVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple
                     ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  *pbVar6 = true;
  sVar4 = View<int,_true,_std::allocator<unsigned_long>_>::size(local_18);
  if (sVar4 == 0) {
    *(undefined8 *)this = 0;
  }
  else {
    sVar4 = View<int,_true,_std::allocator<unsigned_long>_>::size(local_18);
    piVar7 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)(this + 0x40),sVar4,(void *)0x0);
    *(int **)this = piVar7;
  }
  bVar2 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(local_18);
  if (bVar2) {
    __dest = *(void **)this;
    __src = local_18->data_;
    sVar4 = View<int,_true,_std::allocator<unsigned_long>_>::size(local_18);
    memcpy(__dest,__src,sVar4 << 2);
  }
  else {
    View<int,_true,_std::allocator<unsigned_long>_>::begin((const_iterator *)&j_1,local_18);
    local_70 = 0;
    while( true ) {
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      if (sVar4 <= local_70) break;
      piVar8 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
      *(int *)(*(long *)this + local_70 * 4) = *piVar8;
      local_70 = local_70 + 1;
      Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
    }
    Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const View<TLocal, isConstLocal, ALocal>& in
) 
: dataAllocator_()
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }

    // adapt geometry
    this->geometry_ = in.geometry_;
    for(std::size_t j=0; j<in.dimension(); ++j) {
        this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
    }
    this->geometry_.isSimple() = true;

    // copy data
    if(in.size() == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
    }
    if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    else {
        typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
        for(std::size_t j=0; j<this->size(); ++j, ++it)  {
            this->data_[j] = static_cast<T>(*it);
        }
    }

    testInvariant();
}